

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv.cc
# Opt level: O1

void btree_str_kv_set_key(void *key,void *str,size_t len)

{
  ushort *puVar1;
  
  puVar1 = (ushort *)malloc((len & 0xffff) + 2);
  *puVar1 = (ushort)len << 8 | (ushort)len >> 8;
  memcpy(puVar1 + 1,str,len & 0xffff);
  *(ushort **)key = puVar1;
  return;
}

Assistant:

void btree_str_kv_set_key(void *key, void *str, size_t len)
{
    void *key_ptr;
    key_len_t keylen = len;
    key_len_t _keylen;

    key_ptr = (void *)malloc(sizeof(key_len_t) + keylen);
    _keylen = _endian_encode(keylen);
    memcpy(key_ptr, &_keylen, sizeof(key_len_t));
    memcpy((uint8_t*)key_ptr + sizeof(key_len_t), str, keylen);
    memcpy(key, &key_ptr, sizeof(void *));
}